

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3DeleteByRowid(Fts3Table *p,sqlite3_value *pRowid,int *pnChng,u32 *aSzDel)

{
  sqlite3_stmt *pSelect;
  int iVar1;
  int iVar2;
  Mem *pMVar3;
  i64 iVar4;
  uchar *zText;
  int iCol;
  long lVar5;
  u32 *pnWord;
  bool bVar6;
  bool bVar7;
  int rc;
  sqlite3_stmt *pStmt;
  int local_64;
  u32 *local_60;
  sqlite3_value *local_58;
  int local_4c;
  sqlite3_stmt *local_48;
  sqlite3_value *local_40;
  int *local_38;
  
  local_64 = 0;
  local_58 = pRowid;
  local_40 = pRowid;
  iVar1 = fts3SqlStmt(p,7,&local_48,&local_40);
  pSelect = local_48;
  if (iVar1 != 0) {
    sqlite3_reset(local_48);
    bVar7 = false;
    local_64 = iVar1;
    goto LAB_00183885;
  }
  iVar1 = sqlite3_step(local_48);
  bVar7 = false;
  if (iVar1 == 100) {
    local_60 = aSzDel;
    local_38 = pnChng;
    iVar1 = langidFromSelect(p,pSelect);
    pMVar3 = columnMem(pSelect,0);
    iVar4 = sqlite3VdbeIntValue(pMVar3);
    columnMallocFailure(pSelect);
    iVar2 = fts3PendingTermsDocid(p,iVar1,iVar4);
    bVar6 = iVar2 == 0;
    if (bVar6) {
      if (p->nColumn < 1) {
        bVar6 = true;
      }
      else {
        lVar5 = 0;
        pnWord = local_60;
        local_4c = iVar1;
        do {
          iVar2 = 0;
          if (p->abNotindexed[lVar5] == '\0') {
            iVar1 = (int)lVar5 + 1;
            zText = sqlite3_column_text(pSelect,iVar1);
            iVar2 = fts3PendingTermsAdd(p,local_4c,(char *)zText,-1,pnWord);
            iVar1 = sqlite3_column_bytes(pSelect,iVar1);
            local_60[p->nColumn] = local_60[p->nColumn] + iVar1;
          }
          bVar6 = iVar2 == 0;
          if (!bVar6) goto LAB_00183858;
          lVar5 = lVar5 + 1;
          pnWord = pnWord + 1;
        } while (lVar5 < p->nColumn);
      }
      bVar7 = true;
      if (!bVar6) goto LAB_00183858;
    }
    else {
LAB_00183858:
      sqlite3_reset(pSelect);
      bVar7 = false;
      local_64 = iVar2;
    }
    aSzDel = local_60;
    pnChng = local_38;
    if (!bVar6) goto LAB_00183885;
  }
  local_64 = sqlite3_reset(pSelect);
LAB_00183885:
  if ((bVar7) && (local_64 == 0)) {
    local_40 = local_58;
    iVar1 = 0;
    bVar7 = true;
    if ((p->zContentTbl == (char *)0x0) &&
       (iVar1 = fts3SqlStmt(p,1,&local_48,&local_40), iVar1 == 0)) {
      iVar1 = sqlite3_step(local_48);
      bVar7 = true;
      if (iVar1 == 100) {
        pMVar3 = columnMem(local_48,0);
        iVar4 = sqlite3VdbeIntValue(pMVar3);
        columnMallocFailure(local_48);
        bVar7 = (int)iVar4 == 0;
      }
      iVar1 = sqlite3_reset(local_48);
    }
    local_64 = iVar1;
    if (iVar1 == 0) {
      if (bVar7) {
        *pnChng = *pnChng + -1;
        if (p->zContentTbl == (char *)0x0) {
          fts3SqlExec(&local_64,p,0,&local_58);
        }
        if (p->bHasDocsize != '\0') {
          fts3SqlExec(&local_64,p,0x13,&local_58);
        }
      }
      else {
        local_64 = fts3DeleteAll(p,1);
        *pnChng = 0;
        memset(aSzDel,0,(long)p->nColumn * 8 + 8);
      }
    }
  }
  return local_64;
}

Assistant:

static int fts3DeleteByRowid(
  Fts3Table *p, 
  sqlite3_value *pRowid, 
  int *pnChng,                    /* IN/OUT: Decrement if row is deleted */
  u32 *aSzDel
){
  int rc = SQLITE_OK;             /* Return code */
  int bFound = 0;                 /* True if *pRowid really is in the table */

  fts3DeleteTerms(&rc, p, pRowid, aSzDel, &bFound);
  if( bFound && rc==SQLITE_OK ){
    int isEmpty = 0;              /* Deleting *pRowid leaves the table empty */
    rc = fts3IsEmpty(p, pRowid, &isEmpty);
    if( rc==SQLITE_OK ){
      if( isEmpty ){
        /* Deleting this row means the whole table is empty. In this case
        ** delete the contents of all three tables and throw away any
        ** data in the pendingTerms hash table.  */
        rc = fts3DeleteAll(p, 1);
        *pnChng = 0;
        memset(aSzDel, 0, sizeof(u32) * (p->nColumn+1) * 2);
      }else{
        *pnChng = *pnChng - 1;
        if( p->zContentTbl==0 ){
          fts3SqlExec(&rc, p, SQL_DELETE_CONTENT, &pRowid);
        }
        if( p->bHasDocsize ){
          fts3SqlExec(&rc, p, SQL_DELETE_DOCSIZE, &pRowid);
        }
      }
    }
  }

  return rc;
}